

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_land_mass_2(dw_map *map,uint8_t x,uint8_t y,uint8_t lm_index)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  int iVar8;
  
  uVar3 = CONCAT71(in_register_00000011,y);
  while( true ) {
    uVar2 = (ulong)x;
    if ((0x77 < x - 1) || (map->tiles[x - 1][uVar3 & 0xffffffff] - 3 < 3)) break;
    x = x - 1;
  }
  puVar6 = map->walkable[uVar2] + (uVar3 & 0xffffffff);
  uVar7 = 0x77;
  iVar8 = 0;
  while ((uVar2 < 0x78 && (2 < puVar6[-0x3840] - 3))) {
    *puVar6 = lm_index;
    uVar7 = uVar2 & 0xffffffff;
    uVar2 = uVar2 + 1;
    iVar8 = iVar8 + 1;
    puVar6 = puVar6 + 0x78;
  }
  uVar4 = y - 1;
  uVar5 = y + 1;
  uVar2 = uVar3;
  for (; (uint)x <= (uint)uVar7; x = x + 1) {
    if (((uVar4 < 0x78) && (2 < map->tiles[x][uVar4] - 3)) && (map->walkable[x][uVar4] == '\0')) {
      iVar1 = map_land_mass_2(map,x,(uint8_t)uVar4,lm_index);
      uVar2 = uVar3 & 0xffffffff;
      iVar8 = iVar8 + iVar1;
    }
    if ((((byte)uVar2 < 0x77) && (2 < map->tiles[x][uVar5] - 3)) &&
       (map->walkable[x][uVar5] == '\0')) {
      iVar1 = map_land_mass_2(map,x,(uint8_t)uVar5,lm_index);
      uVar2 = uVar3 & 0xffffffff;
      iVar8 = iVar8 + iVar1;
    }
  }
  return iVar8;
}

Assistant:

static int map_land_mass_2(dw_map *map, uint8_t x, uint8_t y,
        uint8_t lm_index)
{
    int size = 0;
    int left = 0;
    int right = 119;

    /* Move all the way to the left */
    while(!map_ob(x-1) && tile_is_walkable(map->tiles[x-1][y]))
        x--;
    left = x;

    while(!map_ob(x) && tile_is_walkable(map->tiles[x][y])) {
        map->walkable[x][y] = lm_index;
        right = x++;
        size++;
    }
    /* go back to the left side and look up & down */
    for (x = left; x <= right; x++) {
        if (!map_ob(y-1) && tile_is_walkable(map->tiles[x][y-1]) &&
                !map->walkable[x][y-1])
            size += map_land_mass_2(map, x, y-1, lm_index);
        if (!map_ob(y+1) && tile_is_walkable(map->tiles[x][y+1]) &&
                !map->walkable[x][y+1])
            size += map_land_mass_2(map, x, y+1, lm_index);
    }
    return size;
}